

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

int __thiscall
sjtu::
DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
::init(DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
       *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  *pLVar4;
  byte in_CL;
  locType loc;
  node tmp;
  ofstream outfile;
  ifstream infile;
  size_t in_stack_fffffffffffff548;
  string *psVar5;
  LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  *in_stack_fffffffffffff550;
  node *this_00;
  undefined8 local_a80;
  undefined1 local_a78 [40];
  LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  *in_stack_fffffffffffff5b0;
  char local_430 [512];
  undefined1 local_15;
  undefined8 local_10;
  undefined8 local_8;
  
  local_15 = in_CL & 1;
  local_10 = ctx;
  local_8 = this;
  if (((this->
       super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
       ).cache !=
       (LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
        *)0x0) &&
     (pLVar4 = (this->
               super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
               ).cache,
     pLVar4 != (LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                *)0x0)) {
    LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
    ::~LRUCache(in_stack_fffffffffffff5b0);
    operator_delete(pLVar4,0x48);
  }
  pLVar4 = (LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
            *)operator_new(0x48);
  LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  ::LRUCache(in_stack_fffffffffffff550,in_stack_fffffffffffff548,(fstream *)0x123733);
  (this->
  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  ).cache = pLVar4;
  this_00 = (node *)&stack0xfffffffffffffdd0;
  std::ifstream::ifstream(this_00,(string *)ctx,_S_in);
  bVar1 = std::ifstream::is_open();
  if (((bVar1 & 1) == 0) || ((local_15 & 1) != 0)) {
    (this->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
    ).is_newfile = true;
    _Var2 = std::operator|(_S_out,_S_bin);
    std::ofstream::ofstream(local_430,(string *)ctx,_Var2);
    BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node::node
              (this_00);
    std::ostream::write(local_430,(long)local_a78);
    local_a80 = 0x648;
    std::ostream::seekp((long)local_430,0xfffff9b8);
    std::ostream::write(local_430,(long)&local_a80);
    std::ofstream::close();
    std::ofstream::~ofstream(local_430);
  }
  else {
    (this->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
    ).is_newfile = false;
  }
  std::ifstream::close();
  psVar5 = (string *)
           &(this->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
            ).file;
  _Var2 = std::operator|(_S_in,_S_out);
  std::operator|(_Var2,_S_bin);
  std::fstream::open(psVar5,(_Ios_Openmode)ctx);
  iVar3 = std::ifstream::~ifstream(&stack0xfffffffffffffdd0);
  return iVar3;
}

Assistant:

virtual void init(std::string filepath , unsigned int cache_size , bool is_reset = false) override
		{
			if (cache) delete cache;
			cache = new LRUCache<T>(cache_size , file);
			std::ifstream infile(filepath , std::ios_base::in);
			if (!infile.is_open() || is_reset)
			{
				is_newfile = true;
				std::ofstream outfile(filepath , std::ios_base::out | std::ios_base::binary);
				T tmp;
				outfile.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				locType loc = sizeof (T);
				outfile.seekp(- sizeof (T) , std::ios_base::cur) , outfile.write(reinterpret_cast<char *> (&loc) , sizeof (locType));
				outfile.close();
			}else is_newfile = false;
			infile.close();
			file.open(filepath , std::ios_base::in | std::ios_base::out | std::ios_base::binary);
		}